

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O0

dlep_parser_value * dlep_session_get_tlv_value(dlep_session *session,uint16_t tlvtype)

{
  avl_node **local_a0;
  dlep_parser_value *value;
  dlep_parser_tlv *tlv;
  uint16_t tlvtype_local;
  dlep_session *session_local;
  uint16_t local_3a;
  dlep_session_parser *local_38;
  avl_node **local_30;
  dlep_session *local_28;
  dlep_session *local_20;
  undefined8 local_18;
  avl_node *local_10;
  
  local_38 = &session->parser;
  local_3a = tlvtype;
  local_10 = avl_find(&local_38->allowed_tlvs,&local_3a);
  local_18 = 0x18;
  if (local_10 == (avl_node *)0x0) {
    local_a0 = (avl_node **)0x0;
  }
  else {
    local_a0 = &local_10[-1].right;
  }
  if (local_a0 == (avl_node **)0x0) {
    if ((log_global_mask[session->log_source] & 2) != 0) {
      oonf_log(LOG_SEVERITY_INFO,session->log_source,"src/generic/dlep/dlep_session.c",0x2a2,
               (void *)0x0,0,"Could not find TLV type %u",(uint)tlvtype);
    }
    session_local = (dlep_session *)0x0;
  }
  else {
    local_30 = local_a0;
    if (*(int *)((long)local_a0 + 4) == -1) {
      local_20 = (dlep_session *)0x0;
    }
    else {
      local_20 = (dlep_session *)((session->parser).values + *(int *)((long)local_a0 + 4));
    }
    session_local = local_20;
    local_28 = session;
    if (local_20 == (dlep_session *)0x0) {
      if ((log_global_mask[session->log_source] & 2) != 0) {
        oonf_log(LOG_SEVERITY_INFO,session->log_source,"src/generic/dlep/dlep_session.c",0x2a8,
                 (void *)0x0,0,"Could not find value of TLV type %u",(uint)tlvtype);
      }
      session_local = (dlep_session *)0x0;
    }
    else {
      if ((log_global_mask[session->log_source] & 1) != 0) {
        oonf_log(LOG_SEVERITY_DEBUG,session->log_source,"src/generic/dlep/dlep_session.c",0x2ac,
                 (void *)0x0,0,"TLV %u has value",(uint)tlvtype);
      }
    }
  }
  return (dlep_parser_value *)session_local;
}

Assistant:

struct dlep_parser_value *
dlep_session_get_tlv_value(struct dlep_session *session, uint16_t tlvtype) {
  struct dlep_parser_tlv *tlv;
  struct dlep_parser_value *value;

  tlv = dlep_parser_get_tlv(&session->parser, tlvtype);
  if (!tlv) {
    OONF_INFO(session->log_source, "Could not find TLV type %u", tlvtype);
    return NULL;
  }

  value = dlep_session_get_tlv_first_value(session, tlv);
  if (!value) {
    OONF_INFO(session->log_source, "Could not find value of TLV type %u", tlvtype);
    return NULL;
  }
  else {
    OONF_DEBUG(session->log_source, "TLV %u has value", tlvtype);
  }
  return value;
}